

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void predict_inter_block(AV1_COMMON *cm,DecoderCodingBlock *dcb,BLOCK_SIZE bsize)

{
  macroblockd_plane *planes;
  int *piVar1;
  uint8_t uVar2;
  BLOCK_SIZE BVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  MB_MODE_INFO *pMVar10;
  MB_MODE_INFO *pMVar11;
  MB_MODE_INFO **ppMVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  byte bVar17;
  uint uVar18;
  uint uVar27;
  int iVar19;
  uint uVar20;
  uint uVar21;
  RefCntBuffer *pRVar22;
  byte bVar23;
  byte bVar24;
  uint8_t *puVar25;
  macroblockd_plane *pmVar26;
  int iVar28;
  scale_factors *sf;
  int iVar29;
  uint uVar30;
  int j;
  ulong uVar31;
  long lVar32;
  bool bVar33;
  build_prediction_ctxt local_1b0;
  int dst_stride2 [3];
  int dst_stride1 [3];
  int local_158 [4];
  int dst_height1 [3];
  int dst_width2 [3];
  int dst_width1 [3];
  uint8_t *dst_buf2 [3];
  uint8_t *dst_buf1 [3];
  undefined1 local_e0 [24];
  int local_c8;
  int local_c4;
  int local_c0;
  
  pMVar10 = *(dcb->xd).mi;
  bVar33 = cm->seq_params->monochrome == '\0';
  iVar19 = (dcb->xd).mi_row;
  iVar4 = (dcb->xd).mi_col;
  lVar32 = 0;
  do {
    bVar17 = pMVar10->ref_frame[lVar32];
    if ('\0' < (char)bVar17) {
      iVar29 = -1;
      if (bVar17 < 9) {
        iVar29 = cm->remapped_ref_idx[(int)(char)bVar17 - 1];
      }
      if (iVar29 == -1) {
        pRVar22 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar22 = cm->ref_frame_map[iVar29];
      }
      iVar29 = -1;
      if (bVar17 < 9) {
        iVar29 = cm->remapped_ref_idx[(int)(char)bVar17 - 1];
      }
      sf = (scale_factors *)0x0;
      if (iVar29 != -1) {
        sf = cm->ref_scale_factors + iVar29;
      }
      (dcb->xd).block_ref_scale_factors[lVar32] = sf;
      av1_setup_pre_planes
                (&dcb->xd,(int)lVar32,&pRVar22->buf,iVar19,iVar4,sf,bVar33 + 1 + (uint)bVar33);
    }
  } while ((lVar32 == 0) && (lVar32 = 1, '\0' < pMVar10->ref_frame[1]));
  uVar2 = cm->seq_params->monochrome;
  planes = (dcb->xd).plane;
  puVar25 = &(dcb->xd).plane[0].height;
  uVar31 = 0;
  do {
    if ((uVar31 != 0) && ((dcb->xd).is_chroma_ref != true)) break;
    dec_build_inter_predictors
              (cm,dcb,(int)uVar31,*(dcb->xd).mi,0,(uint)puVar25[-1],(uint)*puVar25,iVar4 << 2,
               iVar19 << 2);
    pMVar11 = *(dcb->xd).mi;
    if (('\0' < pMVar11->ref_frame[0]) &&
       (((pMVar11->ref_frame[1] == '\0' && (0xf8 < (byte)(pMVar11->bsize - BLOCK_32X64))) &&
        (0xfb < (byte)(pMVar11->mode - 0x11))))) {
      local_e0._0_8_ = (dcb->xd).plane[0].dst.buf;
      local_e0._8_8_ = (dcb->xd).plane[1].dst.buf;
      local_e0._16_8_ = (dcb->xd).plane[2].dst.buf;
      local_c8 = (dcb->xd).plane[0].dst.stride;
      local_c4 = (dcb->xd).plane[1].dst.stride;
      local_c0 = (dcb->xd).plane[2].dst.stride;
      av1_build_interintra_predictor
                (cm,&dcb->xd,((buf_2d *)(puVar25 + -0x99))->buf,*(int *)(puVar25 + -0x81),
                 (BUFFER_SET *)local_e0,(int)uVar31,bsize);
    }
    if (uVar2 != '\0') break;
    puVar25 = puVar25 + 0xa30;
    bVar33 = uVar31 < 2;
    uVar31 = uVar31 + 1;
  } while (bVar33);
  if (pMVar10->motion_mode == '\x01') {
    uVar2 = cm->seq_params->monochrome;
    dst_stride1[2] = 0x80;
    dst_stride1[0] = 0x80;
    dst_stride1[1] = 0x80;
    dst_stride2[2] = 0x80;
    dst_stride2[0] = 0x80;
    dst_stride2[1] = 0x80;
    dst_width1[2] = 0x80;
    dst_width1[0] = 0x80;
    dst_width1[1] = 0x80;
    dst_width2[2] = 0x80;
    dst_width2[0] = 0x80;
    dst_width2[1] = 0x80;
    dst_height1[2] = 0x80;
    dst_height1[0] = 0x80;
    dst_height1[1] = 0x80;
    local_158[2] = 0x80;
    local_158[0] = 0x80;
    local_158[1] = 0x80;
    av1_setup_obmc_dst_bufs(&dcb->xd,dst_buf1,dst_buf2);
    if ((dcb->xd).up_available == true) {
      bVar17 = (dcb->xd).height;
      iVar19 = 0x100;
      if (bVar17 < 0x10) {
        iVar19 = (uint)bVar17 << 4;
      }
      iVar19 = (uint)bVar17 * 0x20 - iVar19;
      piVar1 = &(dcb->xd).mb_to_bottom_edge;
      *piVar1 = *piVar1 + iVar19;
      local_1b0.tmp_width = dst_width1;
      local_1b0.tmp_height = dst_height1;
      local_1b0.tmp_stride = dst_stride1;
      local_1b0.mb_to_far_edge = (dcb->xd).mb_to_right_edge;
      ppMVar12 = (dcb->xd).mi;
      uVar5 = (dcb->xd).mi_col;
      lVar32 = (long)(int)uVar5;
      iVar29 = (dcb->xd).width + uVar5;
      iVar4 = (cm->mi_params).mi_cols;
      if (iVar4 <= iVar29) {
        iVar29 = iVar4;
      }
      local_1b0.cm = cm;
      local_1b0.tmp_buf = dst_buf1;
      local_1b0.dcb = dcb;
      if (((0x3efffcUL >> ((ulong)(*ppMVar12)->bsize & 0x3f) & 1) != 0) && ((int)uVar5 < iVar29)) {
        iVar4 = max_neighbor_obmc[""[(*ppMVar12)->bsize]];
        uVar20 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
        lVar16 = (long)(dcb->xd).mi_stride;
        iVar28 = 0;
        uVar30 = uVar5;
        do {
          bVar17 = 0x10;
          if ((0x1f07ffUL >> ((ulong)ppMVar12[((int)uVar30 - lVar16) - lVar32]->bsize & 0x3f) & 1)
              != 0) {
            bVar17 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [ppMVar12[((int)uVar30 - lVar16) - lVar32]->bsize];
          }
          lVar13 = ((int)uVar30 - lVar16) - lVar32;
          uVar27 = uVar30 & 0xfffffffe;
          uVar18 = (uint)bVar17;
          if (bVar17 == 1) {
            uVar18 = 2;
            uVar30 = uVar27;
            lVar13 = (((long)(int)uVar27 + 1) - lVar16) - lVar32;
          }
          pMVar10 = ppMVar12[lVar13];
          if (((pMVar10->field_0xa7 & 0x80) != 0) || ('\0' < pMVar10->ref_frame[0])) {
            uVar27._0_1_ = (dcb->xd).width;
            uVar27._1_1_ = (dcb->xd).height;
            uVar27._2_2_ = *(undefined2 *)&(dcb->xd).field_0x2076;
            if ((byte)uVar18 <= (byte)(undefined1)uVar27) {
              uVar27 = uVar18;
            }
            iVar6 = (dcb->xd).mi_col;
            memcpy((MB_MODE_INFO *)local_e0,pMVar10,0xb0);
            av1_setup_build_prediction_by_above_pred
                      (&dcb->xd,uVar30 - uVar5,(uint8_t)uVar27,(MB_MODE_INFO *)local_e0,&local_1b0,
                       uVar20);
            iVar7 = (dcb->xd).mi_row;
            BVar3 = (*(dcb->xd).mi)->bsize;
            bVar17 = block_size_high[BVar3];
            uVar31 = 0;
            pmVar26 = planes;
            do {
              iVar8 = pmVar26->subsampling_x;
              iVar9 = pmVar26->subsampling_y;
              iVar14 = av1_skip_u4x4_pred_in_obmc(BVar3,pmVar26,0);
              if (iVar14 == 0) {
                bVar23 = (char)iVar9 + 1;
                uVar21 = (uint)(bVar17 >> (bVar23 & 0x1f));
                uVar15 = 0x40 >> (bVar23 & 0x1f);
                if ((int)uVar21 < (int)uVar15) {
                  uVar15 = uVar21;
                }
                if (uVar21 < 4) {
                  uVar15 = 4;
                }
                dec_build_inter_predictors
                          (local_1b0.cm,(DecoderCodingBlock *)local_1b0.dcb,(int)uVar31,
                           (MB_MODE_INFO *)local_e0,1,((uVar27 & 0xff) << 2) >> ((byte)iVar8 & 0x1f)
                           ,uVar15,(iVar6 + (uVar30 - uVar5)) * 4,iVar7 << 2);
              }
              uVar31 = uVar31 + 1;
              pmVar26 = pmVar26 + 1;
            } while (uVar20 != uVar31);
            iVar28 = iVar28 + 1;
          }
          uVar30 = uVar30 + uVar18;
        } while (((int)uVar30 < iVar29) && (iVar28 < iVar4));
      }
      (dcb->xd).mb_to_left_edge = (dcb->xd).mi_col * -0x20;
      (dcb->xd).mb_to_right_edge = local_1b0.mb_to_far_edge;
      piVar1 = &(dcb->xd).mb_to_bottom_edge;
      *piVar1 = *piVar1 - iVar19;
    }
    if ((dcb->xd).left_available == true) {
      bVar17 = (dcb->xd).width;
      iVar19 = 0x100;
      if (bVar17 < 0x10) {
        iVar19 = (uint)bVar17 << 4;
      }
      iVar19 = (uint)bVar17 * 0x20 - iVar19;
      piVar1 = &(dcb->xd).mb_to_right_edge;
      *piVar1 = *piVar1 + iVar19;
      local_1b0.tmp_width = dst_width2;
      local_1b0.tmp_height = local_158;
      local_1b0.tmp_stride = dst_stride2;
      local_1b0.mb_to_far_edge = (dcb->xd).mb_to_bottom_edge;
      ppMVar12 = (dcb->xd).mi;
      uVar5 = (dcb->xd).mi_row;
      iVar29 = (dcb->xd).height + uVar5;
      iVar4 = (cm->mi_params).mi_rows;
      if (iVar4 <= iVar29) {
        iVar29 = iVar4;
      }
      local_1b0.cm = cm;
      local_1b0.tmp_buf = dst_buf2;
      local_1b0.dcb = dcb;
      if (((0x3dfffaUL >> ((ulong)(*ppMVar12)->bsize & 0x3f) & 1) != 0) && ((int)uVar5 < iVar29)) {
        iVar4 = max_neighbor_obmc[""[(*ppMVar12)->bsize]];
        uVar20 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
        lVar32 = (long)(dcb->xd).mi_stride * (long)(int)uVar5;
        iVar28 = 0;
        uVar30 = uVar5;
        do {
          iVar6 = (dcb->xd).mi_stride;
          lVar16 = (long)(int)(iVar6 * uVar30);
          bVar17 = 0x10;
          if ((0x2f0bffUL >> ((ulong)ppMVar12[(lVar16 + -1) - lVar32]->bsize & 0x3f) & 1) != 0) {
            bVar17 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [ppMVar12[(lVar16 + -1) - lVar32]->bsize];
          }
          uVar18 = (uint)bVar17;
          if (bVar17 == 1) {
            uVar18 = 2;
            lVar16 = (long)(int)(iVar6 * (uVar30 | 1));
            uVar30 = uVar30 & 0xfffffffe;
          }
          pMVar10 = ppMVar12[(lVar16 + -1) - lVar32];
          if (((pMVar10->field_0xa7 & 0x80) != 0) || ('\0' < pMVar10->ref_frame[0])) {
            bVar17 = (dcb->xd).height;
            if ((byte)uVar18 <= bVar17) {
              bVar17 = (byte)uVar18;
            }
            iVar6 = (dcb->xd).mi_row;
            memcpy((MB_MODE_INFO *)local_e0,pMVar10,0xb0);
            av1_setup_build_prediction_by_left_pred
                      (&dcb->xd,uVar30 - uVar5,bVar17,(MB_MODE_INFO *)local_e0,&local_1b0,uVar20);
            iVar7 = (dcb->xd).mi_col;
            BVar3 = (*(dcb->xd).mi)->bsize;
            bVar23 = block_size_wide[BVar3];
            uVar31 = 0;
            pmVar26 = planes;
            do {
              iVar8 = pmVar26->subsampling_x;
              iVar9 = pmVar26->subsampling_y;
              iVar14 = av1_skip_u4x4_pred_in_obmc(BVar3,pmVar26,1);
              if (iVar14 == 0) {
                bVar24 = (char)iVar8 + 1;
                uVar15 = (uint)(bVar23 >> (bVar24 & 0x1f));
                uVar27 = 0x40 >> (bVar24 & 0x1f);
                if ((int)uVar15 < (int)uVar27) {
                  uVar27 = uVar15;
                }
                if (uVar15 < 4) {
                  uVar27 = 4;
                }
                dec_build_inter_predictors
                          (local_1b0.cm,(DecoderCodingBlock *)local_1b0.dcb,(int)uVar31,
                           (MB_MODE_INFO *)local_e0,1,uVar27,
                           ((uint)bVar17 << 2) >> ((byte)iVar9 & 0x1f),iVar7 << 2,
                           (iVar6 + (uVar30 - uVar5)) * 4);
              }
              uVar31 = uVar31 + 1;
              pmVar26 = pmVar26 + 1;
            } while (uVar20 != uVar31);
            iVar28 = iVar28 + 1;
          }
          uVar30 = uVar30 + uVar18;
        } while (((int)uVar30 < iVar29) && (iVar28 < iVar4));
      }
      (dcb->xd).mb_to_top_edge = (dcb->xd).mi_row * -0x20;
      piVar1 = &(dcb->xd).mb_to_right_edge;
      *piVar1 = *piVar1 - iVar19;
      (dcb->xd).mb_to_bottom_edge = local_1b0.mb_to_far_edge;
    }
    bVar33 = uVar2 == '\0';
    av1_setup_dst_planes
              (planes,(*(dcb->xd).mi)->bsize,&cm->cur_frame->buf,(dcb->xd).mi_row,(dcb->xd).mi_col,0
               ,bVar33 + 1 + (uint)bVar33);
    av1_build_obmc_inter_prediction(cm,&dcb->xd,dst_buf1,dst_stride1,dst_buf2,dst_stride2);
  }
  return;
}

Assistant:

static inline void predict_inter_block(AV1_COMMON *const cm,
                                       DecoderCodingBlock *dcb,
                                       BLOCK_SIZE bsize) {
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
    const MV_REFERENCE_FRAME frame = mbmi->ref_frame[ref];
    if (frame < LAST_FRAME) {
      assert(is_intrabc_block(mbmi));
      assert(frame == INTRA_FRAME);
      assert(ref == 0);
    } else {
      const RefCntBuffer *ref_buf = get_ref_frame_buf(cm, frame);
      const struct scale_factors *ref_scale_factors =
          get_ref_scale_factors_const(cm, frame);

      xd->block_ref_scale_factors[ref] = ref_scale_factors;
      av1_setup_pre_planes(xd, ref, &ref_buf->buf, mi_row, mi_col,
                           ref_scale_factors, num_planes);
    }
  }

  dec_build_inter_predictor(cm, dcb, mi_row, mi_col, bsize);
  if (mbmi->motion_mode == OBMC_CAUSAL) {
    dec_build_obmc_inter_predictors_sb(cm, dcb);
  }
#if CONFIG_MISMATCH_DEBUG
  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    int pixel_c, pixel_r;
    mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, 0, 0, pd->subsampling_x,
                    pd->subsampling_y);
    if (!is_chroma_reference(mi_row, mi_col, bsize, pd->subsampling_x,
                             pd->subsampling_y))
      continue;
    mismatch_check_block_pre(pd->dst.buf, pd->dst.stride,
                             cm->current_frame.order_hint, plane, pixel_c,
                             pixel_r, pd->width, pd->height,
                             xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
  }
#endif
}